

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O1

void __thiscall
tensor_t<gradient_t>::tensor_t(tensor_t<gradient_t> *this,tensor_t<gradient_t> *other)

{
  int iVar1;
  
  (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->size).x = 0;
  (this->size).y = 0;
  (this->size).z = 0;
  std::vector<gradient_t,_std::allocator<gradient_t>_>::operator=(&this->data,&other->data);
  (this->size).z = (other->size).z;
  iVar1 = (other->size).y;
  (this->size).x = (other->size).x;
  (this->size).y = iVar1;
  return;
}

Assistant:

tensor_t(const tensor_t &other) {
    data = other.data;
    size = other.size;
  }